

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O1

void __thiscall QMessageDialogOptions::removeButton(QMessageDialogOptions *this,int id)

{
  long in_FS_OFFSET;
  CustomButton local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.label.d.size = 0;
  local_38.label.d.d = (Data *)0x0;
  local_38.label.d.ptr = (char16_t *)0x0;
  local_38.role = EOL;
  local_38.button = (void *)0x0;
  local_38.id = id;
  QtPrivate::
  sequential_erase_one<QList<QMessageDialogOptions::CustomButton>,QMessageDialogOptions::CustomButton>
            ((QList<QMessageDialogOptions::CustomButton> *)(*(long *)this + 0x70),&local_38);
  if (&(local_38.label.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.label.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.label.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.label.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.label.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageDialogOptions::removeButton(int id)
{
    d->customButtons.removeOne(CustomButton(id));
}